

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O2

base_learner * boosting_setup(options_i *options,vw *all)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  option_group_definition *poVar4;
  typed_option<float> *op;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *op_00;
  ostream *poVar5;
  base_learner *pbVar6;
  single_learner *psVar7;
  learner<boosting,_example> *plVar8;
  code *pcVar9;
  undefined8 uVar10;
  vw_exception *this;
  undefined8 uVar11;
  free_ptr<boosting> data;
  allocator local_44f;
  allocator local_44e;
  allocator local_44d;
  allocator local_44c;
  allocator local_44b;
  allocator local_44a;
  allocator local_449;
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  option_group_definition new_options;
  typed_option<float> local_2f0;
  stringstream __msg;
  undefined1 local_240 [96];
  bool local_1e0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  
  scoped_calloc_or_throw<boosting>();
  std::__cxx11::string::string((string *)&local_368,"Boosting",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::string((string *)&local_388,"boosting",&local_449);
  VW::config::typed_option<int>::typed_option
            ((typed_option<int> *)&__msg,&local_388,
             &(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->N);
  local_1e0 = true;
  std::__cxx11::string::string(local_428,"Online boosting with <N> weak learners",&local_44a);
  std::__cxx11::string::_M_assign((string *)(local_240 + 0x20));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>
                     (&new_options,(typed_option<int> *)&__msg);
  std::__cxx11::string::string((string *)&local_3a8,"gamma",&local_44b);
  VW::config::typed_option<float>::typed_option
            (&local_2f0,&local_3a8,
             &(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->gamma);
  op = VW::config::typed_option<float>::default_value(&local_2f0,0.1);
  std::__cxx11::string::string
            (local_448,"weak learner\'s edge (=0.1), used only by online BBM",&local_44c);
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar4,op);
  std::__cxx11::string::string((string *)&local_3c8,"alg",&local_44d);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_c8,&local_3c8,
               &(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->alg);
  local_c8.super_base_option.m_keep = true;
  std::__cxx11::string::string((string *)&local_3e8,"BBM",&local_44e);
  op_00 = VW::config::
          typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::default_value(&local_c8,&local_3e8);
  std::__cxx11::string::string
            (local_408,
             "specify the boosting algorithm: BBM (default), logistic (AdaBoost.OL.W), adaptive (AdaBoost.OL)"
             ,&local_44f);
  std::__cxx11::string::_M_assign((string *)&(op_00->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (poVar4,op_00);
  std::__cxx11::string::~string(local_408);
  std::__cxx11::string::~string((string *)&local_3e8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string(local_448);
  VW::config::typed_option<float>::~typed_option(&local_2f0);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string(local_428);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)&__msg);
  std::__cxx11::string::~string((string *)&local_388);
  (**options->_vptr_options_i)(options,&new_options);
  std::__cxx11::string::string((string *)&__msg,"boosting",(allocator *)&local_2f0);
  iVar3 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar3 == '\0') {
    plVar8 = (learner<boosting,_example> *)0x0;
  }
  else {
    bVar1 = all->quiet;
    if ((bool)bVar1 == false) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Number of weak learners = ");
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                                  super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                                  super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->N);
      std::endl<char,std::char_traits<char>>(poVar5);
      bVar1 = all->quiet;
    }
    if ((bVar1 & 1) == 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Gamma = ");
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                                  super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                                  super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->gamma);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    iVar3 = (data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
             super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
             super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->N;
    local_c8.super_base_option._vptr_base_option = (_func_int **)0xffffffffffffffff;
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)&local_2f0,(long)iVar3,
               (value_type_conflict6 *)&local_c8,(allocator_type *)local_428);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              *)&__msg,(long)iVar3,(value_type *)&local_2f0,(allocator_type *)local_448);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::_M_move_assign(&(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                       super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                       super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->C,&__msg);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               *)&__msg);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              ((_Vector_base<long,_std::allocator<long>_> *)&local_2f0);
    (data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.super__Head_base<0UL,_boosting_*,_false>.
    _M_head_impl)->t = 0;
    (data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.super__Head_base<0UL,_boosting_*,_false>.
    _M_head_impl)->all = all;
    local_2f0.super_base_option._vptr_base_option._0_4_ = 0;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&__msg,
               (long)(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                      super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                      super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->N,
               (value_type_conflict3 *)&local_2f0,(allocator_type *)&local_c8);
    std::vector<float,_std::allocator<float>_>::_M_move_assign
              (&(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->alpha,&__msg);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&__msg);
    local_2f0.super_base_option._vptr_base_option._0_4_ = 0x3f800000;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&__msg,
               (long)(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                      super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                      super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->N,
               (value_type_conflict3 *)&local_2f0,(allocator_type *)&local_c8);
    std::vector<float,_std::allocator<float>_>::_M_move_assign
              (&(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->v,&__msg);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&__msg);
    bVar2 = std::operator==(&(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                              super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                              super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->alg,"BBM");
    if (bVar2) {
      pbVar6 = setup_base(options,all);
      psVar7 = LEARNER::as_singleline<char,char>(pbVar6);
      plVar8 = LEARNER::init_learner<boosting,example,LEARNER::learner<char,example>>
                         (&data,psVar7,predict_or_learn<true>,predict_or_learn<false>,
                          (long)(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                                 super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                                 super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->N);
      uVar10 = *(undefined8 *)(plVar8 + 0x18);
      uVar11 = *(undefined8 *)(plVar8 + 0x20);
    }
    else {
      bVar2 = std::operator==(&(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->alg,
                              "logistic");
      if (bVar2) {
        pbVar6 = setup_base(options,all);
        psVar7 = LEARNER::as_singleline<char,char>(pbVar6);
        plVar8 = LEARNER::init_learner<boosting,example,LEARNER::learner<char,example>>
                           (&data,psVar7,predict_or_learn_logistic<true>,
                            predict_or_learn_logistic<false>,
                            (long)(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                                   super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                                   super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->N);
        pcVar9 = save_load;
      }
      else {
        bVar2 = std::operator==(&(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                                  super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                                  super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->alg,
                                "adaptive");
        if (!bVar2) {
          std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
          poVar5 = std::operator<<((ostream *)local_240,"Unrecognized boosting algorithm: \'");
          poVar5 = std::operator<<(poVar5,(string *)
                                          &(data._M_t.
                                            super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                                            super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                                            super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->
                                           alg);
          std::operator<<(poVar5,"\' Bailing!");
          this = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (this,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/boosting.cc"
                     ,0x1c3,&local_348);
          __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        pbVar6 = setup_base(options,all);
        psVar7 = LEARNER::as_singleline<char,char>(pbVar6);
        plVar8 = LEARNER::init_learner<boosting,example,LEARNER::learner<char,example>>
                           (&data,psVar7,predict_or_learn_adaptive<true>,
                            predict_or_learn_adaptive<false>,
                            (long)(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                                   super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                                   super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->N);
        pcVar9 = save_load_sampling;
      }
      *(code **)(plVar8 + 0x80) = pcVar9;
      uVar10 = *(undefined8 *)(plVar8 + 0x18);
      uVar11 = *(undefined8 *)(plVar8 + 0x20);
      *(undefined8 *)(plVar8 + 0x70) = uVar10;
      *(undefined8 *)(plVar8 + 0x78) = uVar11;
    }
    *(undefined8 *)(plVar8 + 0xb8) = uVar10;
    *(undefined8 *)(plVar8 + 0xc0) = uVar11;
    *(code **)(plVar8 + 200) = finish;
    *(undefined8 *)(plVar8 + 0x58) = uVar10;
    *(code **)(plVar8 + 0x68) = return_example;
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<boosting,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar8;
}

Assistant:

LEARNER::base_learner* boosting_setup(options_i& options, vw& all)
{
  free_ptr<boosting> data = scoped_calloc_or_throw<boosting>();
  option_group_definition new_options("Boosting");
  new_options.add(make_option("boosting", data->N).keep().help("Online boosting with <N> weak learners"))
      .add(make_option("gamma", data->gamma)
               .default_value(0.1f)
               .help("weak learner's edge (=0.1), used only by online BBM"))
      .add(
          make_option("alg", data->alg)
              .keep()
              .default_value("BBM")
              .help("specify the boosting algorithm: BBM (default), logistic (AdaBoost.OL.W), adaptive (AdaBoost.OL)"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("boosting"))
    return nullptr;

  // Description of options:
  // "BBM" implements online BBM (Algorithm 1 in BLK'15)
  // "logistic" implements AdaBoost.OL.W (importance weighted version
  // 	    of Algorithm 2 in BLK'15)
  // "adaptive" implements AdaBoost.OL (Algorithm 2 in BLK'15,
  // 	    using sampling rather than importance weighting)

  if (!all.quiet)
    cerr << "Number of weak learners = " << data->N << endl;
  if (!all.quiet)
    cerr << "Gamma = " << data->gamma << endl;

  data->C = std::vector<std::vector<int64_t> >(data->N, std::vector<int64_t>(data->N, -1));
  data->t = 0;
  data->all = &all;
  data->alpha = std::vector<float>(data->N, 0);
  data->v = std::vector<float>(data->N, 1);

  learner<boosting, example>* l;
  if (data->alg == "BBM")
    l = &init_learner<boosting, example>(
        data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>, data->N);
  else if (data->alg == "logistic")
  {
    l = &init_learner<boosting, example>(data, as_singleline(setup_base(options, all)), predict_or_learn_logistic<true>,
        predict_or_learn_logistic<false>, data->N);
    l->set_save_load(save_load);
  }
  else if (data->alg == "adaptive")
  {
    l = &init_learner<boosting, example>(data, as_singleline(setup_base(options, all)), predict_or_learn_adaptive<true>,
        predict_or_learn_adaptive<false>, data->N);
    l->set_save_load(save_load_sampling);
  }
  else
    THROW("Unrecognized boosting algorithm: \'" << data->alg << "\' Bailing!");

  l->set_finish(finish);
  l->set_finish_example(return_example);

  return make_base(*l);
}